

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O0

void __thiscall
Effects_Buffer::mix_enhanced(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  undefined4 uVar1;
  long lVar2;
  undefined2 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  short *psVar7;
  short *psVar8;
  byte bVar9;
  int iVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int in_EDX;
  undefined2 *in_RSI;
  long in_RDI;
  int right;
  int left;
  int sum3_s;
  fixed_t reverb_level;
  int new_reverb_r;
  int new_reverb_l;
  int sum2_s;
  int sum1_s;
  int reverb_pos;
  int echo_pos;
  blip_sample_t *echo_buf;
  blip_sample_t *reverb_buf;
  blip_long sq2_reader_accum;
  buf_t_ *sq2_reader_buf;
  blip_long sq1_reader_accum;
  buf_t_ *sq1_reader_buf;
  blip_long r2_reader_accum;
  buf_t_ *r2_reader_buf;
  blip_long l2_reader_accum;
  buf_t_ *l2_reader_buf;
  blip_long r1_reader_accum;
  buf_t_ *r1_reader_buf;
  blip_long l1_reader_accum;
  buf_t_ *l1_reader_buf;
  blip_long center_reader_accum;
  buf_t_ *center_reader_buf;
  int bass;
  blip_sample_t *out;
  int local_d0;
  uint local_b0;
  uint local_ac;
  int local_94;
  int *local_90;
  int local_84;
  int *local_80;
  int local_74;
  int *local_70;
  int local_64;
  int *local_60;
  int local_54;
  int *local_50;
  int local_44;
  int *local_40;
  int local_34;
  int *local_30;
  undefined2 *local_20;
  int local_14;
  
  uVar1 = *(undefined4 *)(in_RDI + 0xb8);
  local_30 = *(int **)(in_RDI + 0xa8);
  local_34 = *(int *)(in_RDI + 0xb4);
  local_40 = *(int **)(in_RDI + 0xe8);
  local_44 = *(int *)(in_RDI + 0xf4);
  local_50 = *(int **)(in_RDI + 0x128);
  local_54 = *(int *)(in_RDI + 0x134);
  local_60 = *(int **)(in_RDI + 0x168);
  local_64 = *(int *)(in_RDI + 0x174);
  local_70 = *(int **)(in_RDI + 0x1a8);
  local_74 = *(int *)(in_RDI + 0x1b4);
  local_80 = *(int **)(in_RDI + 0x28);
  local_84 = *(int *)(in_RDI + 0x34);
  local_90 = *(int **)(in_RDI + 0x68);
  local_94 = *(int *)(in_RDI + 0x74);
  psVar7 = blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x280));
  psVar8 = blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x290));
  local_ac = *(uint *)(in_RDI + 0x2a4);
  local_b0 = *(uint *)(in_RDI + 0x2a0);
  puVar3 = in_RSI;
  local_14 = in_EDX;
  while (local_20 = puVar3, iVar10 = local_14 + -1, local_14 != 0) {
    iVar4 = local_84 >> 0xe;
    iVar5 = local_94 >> 0xe;
    piVar11 = local_80 + 1;
    bVar9 = (byte)uVar1;
    local_84 = (*local_80 - (local_84 >> (bVar9 & 0x1f))) + local_84;
    piVar12 = local_90 + 1;
    local_94 = (*local_90 - (local_94 >> (bVar9 & 0x1f))) + local_94;
    iVar6 = (int)((long)iVar4 * *(long *)(in_RDI + 0x2a8) >> 0xf) +
            (int)((long)iVar5 * *(long *)(in_RDI + 0x2b8) >> 0xf) + (local_44 >> 0xe) +
            (int)psVar7[local_b0 + *(int *)(in_RDI + 0x2d8) & 0x3fff];
    iVar4 = (int)((long)iVar4 * *(long *)(in_RDI + 0x2b0) >> 0xf) +
            (int)((long)iVar5 * *(long *)(in_RDI + 0x2c0) >> 0xf) + (local_54 >> 0xe) +
            (int)psVar7[local_b0 + *(int *)(in_RDI + 0x2dc) & 0x3fff];
    piVar13 = local_40 + 1;
    local_44 = (*local_40 - (local_44 >> (bVar9 & 0x1f))) + local_44;
    piVar14 = local_50 + 1;
    local_54 = (*local_50 - (local_54 >> (bVar9 & 0x1f))) + local_54;
    lVar2 = *(long *)(in_RDI + 0x2e0);
    psVar7[(int)local_b0] = (short)(iVar6 * lVar2 >> 0xf);
    psVar7[(int)(local_b0 + 1)] = (short)(iVar4 * lVar2 >> 0xf);
    local_b0 = local_b0 + 2 & 0x3fff;
    iVar5 = local_34 >> 0xe;
    piVar15 = local_30 + 1;
    local_34 = (*local_30 - (local_34 >> (bVar9 & 0x1f))) + local_34;
    local_d0 = iVar6 + iVar5 + (local_64 >> 0xe) +
               (int)(*(long *)(in_RDI + 0x2d0) *
                     (long)psVar8[local_ac + *(int *)(in_RDI + 0x2c8) & 0xfff] >> 0xf);
    iVar4 = iVar4 + iVar5 + (local_74 >> 0xe) +
            (int)(*(long *)(in_RDI + 0x2d0) *
                  (long)psVar8[local_ac + *(int *)(in_RDI + 0x2cc) & 0xfff] >> 0xf);
    piVar16 = local_60 + 1;
    local_64 = (*local_60 - (local_64 >> (bVar9 & 0x1f))) + local_64;
    piVar17 = local_70 + 1;
    local_74 = (*local_70 - (local_74 >> (bVar9 & 0x1f))) + local_74;
    psVar8[(int)local_ac] = (short)iVar5;
    local_ac = local_ac + 1 & 0xfff;
    if ((short)local_d0 != local_d0) {
      local_d0 = 0x7fff - (local_d0 >> 0x18);
    }
    *local_20 = (short)local_d0;
    local_20[1] = (short)iVar4;
    local_90 = piVar12;
    local_80 = piVar11;
    local_70 = piVar17;
    local_60 = piVar16;
    local_50 = piVar14;
    local_40 = piVar13;
    local_30 = piVar15;
    puVar3 = local_20 + 2;
    local_14 = iVar10;
    if ((short)iVar4 != iVar4) {
      local_20[1] = 0x7fff - (char)((uint)iVar4 >> 0x18);
    }
  }
  *(uint *)(in_RDI + 0x2a0) = local_b0;
  *(uint *)(in_RDI + 0x2a4) = local_ac;
  *(int *)(in_RDI + 0xf4) = local_44;
  *(int *)(in_RDI + 0x134) = local_54;
  *(int *)(in_RDI + 0x174) = local_64;
  *(int *)(in_RDI + 0x1b4) = local_74;
  *(int *)(in_RDI + 0x34) = local_84;
  *(int *)(in_RDI + 0x74) = local_94;
  *(int *)(in_RDI + 0xb4) = local_34;
  return;
}

Assistant:

void Effects_Buffer::mix_enhanced( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [2] );
	BLIP_READER_BEGIN( center, bufs [2] );
	BLIP_READER_BEGIN( l1, bufs [3] );
	BLIP_READER_BEGIN( r1, bufs [4] );
	BLIP_READER_BEGIN( l2, bufs [5] );
	BLIP_READER_BEGIN( r2, bufs [6] );
	BLIP_READER_BEGIN( sq1, bufs [0] );
	BLIP_READER_BEGIN( sq2, bufs [1] );
	
	blip_sample_t* const reverb_buf = this->reverb_buf.begin();
	blip_sample_t* const echo_buf = this->echo_buf.begin();
	int echo_pos = this->echo_pos;
	int reverb_pos = this->reverb_pos;
	
	while ( count-- )
	{
		int sum1_s = BLIP_READER_READ( sq1 );
		int sum2_s = BLIP_READER_READ( sq2 );
		
		BLIP_READER_NEXT( sq1, bass );
		BLIP_READER_NEXT( sq2, bass );
		
		int new_reverb_l = FMUL( sum1_s, chans.pan_1_levels [0] ) +
				FMUL( sum2_s, chans.pan_2_levels [0] ) + BLIP_READER_READ( l1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_l) & reverb_mask];
		
		int new_reverb_r = FMUL( sum1_s, chans.pan_1_levels [1] ) +
				FMUL( sum2_s, chans.pan_2_levels [1] ) + BLIP_READER_READ( r1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_r) & reverb_mask];
		
		BLIP_READER_NEXT( l1, bass );
		BLIP_READER_NEXT( r1, bass );
		
		fixed_t reverb_level = chans.reverb_level;
		reverb_buf [reverb_pos] = (blip_sample_t) FMUL( new_reverb_l, reverb_level );
		reverb_buf [reverb_pos + 1] = (blip_sample_t) FMUL( new_reverb_r, reverb_level );
		reverb_pos = (reverb_pos + 2) & reverb_mask;
		
		int sum3_s = BLIP_READER_READ( center );
		BLIP_READER_NEXT( center, bass );
		
		int left = new_reverb_l + sum3_s + BLIP_READER_READ( l2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_l) & echo_mask] );
		int right = new_reverb_r + sum3_s + BLIP_READER_READ( r2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_r) & echo_mask] );
		
		BLIP_READER_NEXT( l2, bass );
		BLIP_READER_NEXT( r2, bass );
		
		echo_buf [echo_pos] = sum3_s;
		echo_pos = (echo_pos + 1) & echo_mask;
		
		if ( (BOOST::int16_t) left != left )
			left = 0x7FFF - (left >> 24);
		
		out [0] = left;
		out [1] = right;
		
		out += 2;
		
		if ( (BOOST::int16_t) right != right )
			out [-1] = 0x7FFF - (right >> 24);
	}
	this->reverb_pos = reverb_pos;
	this->echo_pos = echo_pos;
	
	BLIP_READER_END( l1, bufs [3] );
	BLIP_READER_END( r1, bufs [4] );
	BLIP_READER_END( l2, bufs [5] );
	BLIP_READER_END( r2, bufs [6] );
	BLIP_READER_END( sq1, bufs [0] );
	BLIP_READER_END( sq2, bufs [1] );
	BLIP_READER_END( center, bufs [2] );
}